

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcSubContractResource::~IfcSubContractResource
          (IfcSubContractResource *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].super_IfcConstructionResource.field_0x68 = 0x83d990;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x50 = 0x83da80;
  *(undefined8 *)
   &this[-1].super_IfcConstructionResource.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>.field_0x10 = 0x83d9b8;
  *(undefined8 *)
   &this[-1].super_IfcConstructionResource.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>.field_0x20 = 0x83d9e0;
  *(undefined8 *)&this[-1].super_IfcConstructionResource.ResourceGroup.have = 0x83da08;
  this[-1].super_IfcConstructionResource.ResourceConsumption.ptr._M_string_length = 0x83da30;
  *(undefined8 *)&this->super_IfcConstructionResource = 0x83da58;
  puVar1 = *(undefined1 **)&(this->super_IfcConstructionResource).field_0x28;
  if (puVar1 != &(this->super_IfcConstructionResource).field_0x38) {
    operator_delete(puVar1);
  }
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
             &(this->super_IfcConstructionResource).field_0x18;
  puVar1 = &this[-1].super_IfcConstructionResource.field_0x68;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  IfcConstructionResource::~IfcConstructionResource
            ((IfcConstructionResource *)puVar1,&PTR_construction_vtable_24__0083da98);
  operator_delete(puVar1);
  return;
}

Assistant:

IfcSubContractResource() : Object("IfcSubContractResource") {}